

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O3

Abc_TtStore_t * Abc_TruthStoreAlloc(int nVars,int nFuncs)

{
  int iVar1;
  Abc_TtStore_t *pAVar2;
  word **ppwVar3;
  word *pwVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  pAVar2 = (Abc_TtStore_t *)malloc(0x18);
  iVar1 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    iVar1 = 1;
  }
  pAVar2->nVars = nVars;
  pAVar2->nWords = iVar1;
  pAVar2->nFuncs = nFuncs;
  lVar7 = (long)iVar1;
  lVar6 = (long)nFuncs;
  ppwVar3 = (word **)malloc((lVar7 * 8 + 8) * lVar6);
  pAVar2->pFuncs = ppwVar3;
  *ppwVar3 = (word *)(ppwVar3 + lVar6);
  memset(ppwVar3 + lVar6,0,lVar7 * 8 * lVar6);
  if (1 < nFuncs) {
    pwVar4 = *ppwVar3;
    uVar5 = 1;
    do {
      pwVar4 = pwVar4 + lVar7;
      ppwVar3[uVar5] = pwVar4;
      uVar5 = uVar5 + 1;
    } while ((uint)nFuncs != uVar5);
  }
  return pAVar2;
}

Assistant:

Abc_TtStore_t * Abc_TruthStoreAlloc( int nVars, int nFuncs )
{
    Abc_TtStore_t * p;
    int i;
    p = (Abc_TtStore_t *)malloc( sizeof(Abc_TtStore_t) );
    p->nVars  =  nVars;
    p->nWords = (nVars < 7) ? 1 : (1 << (nVars-6));
    p->nFuncs =  nFuncs;
    // alloc storage for 'nFuncs' truth tables as one chunk of memory
    p->pFuncs = (word **)malloc( (sizeof(word *) + sizeof(word) * p->nWords) * p->nFuncs );
    // assign and clean the truth table storage
    p->pFuncs[0] = (word *)(p->pFuncs + p->nFuncs);
    memset( p->pFuncs[0], 0, sizeof(word) * p->nWords * p->nFuncs );
    // split it up into individual truth tables
    for ( i = 1; i < p->nFuncs; i++ )
        p->pFuncs[i] = p->pFuncs[i-1] + p->nWords;
    return p;
}